

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::AnyIsFinished
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  bool bVar1;
  uint uVar2;
  element_type *this;
  reference ppVar3;
  element_type *this_00;
  element_type *peVar4;
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  ScriptIPtr s;
  pair<const_Jinx::Variant,_Jinx::Variant> *pair;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  undefined1 local_30 [7];
  bool anyFinished;
  CollectionPtr collPtr;
  Parameters *params_local;
  ScriptPtr *script_local;
  
  collPtr.
  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)params;
  std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[](params,0);
  Variant::GetCollection((Variant *)local_30);
  __range2._7_1_ = false;
  this = std::
         __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_30);
  __end2 = std::
           map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
           ::begin(this);
  pair = (pair<const_Jinx::Variant,_Jinx::Variant> *)
         std::
         map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
         ::end(this);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&pair);
    if (!bVar1) {
LAB_0013ff2c:
      Variant::Variant(__return_storage_ptr__,__range2._7_1_);
      local_90._20_4_ = 1;
LAB_0013ff48:
      std::
      shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
      ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)local_30);
      return __return_storage_ptr__;
    }
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator*
                       (&__end2);
    bVar1 = Variant::IsCoroutine(&ppVar3->second);
    if (!bVar1) {
      std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>
                ((shared_ptr<Jinx::IScript> *)local_78);
      this_00 = std::
                __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_78);
      Script::Error(this_00,"Invalid parameters to \'any (of) {} (is) finished\' function");
      Variant::Variant(__return_storage_ptr__,false);
      local_90._20_4_ = 1;
      std::shared_ptr<Jinx::Impl::Script>::~shared_ptr((shared_ptr<Jinx::Impl::Script> *)local_78);
      goto LAB_0013ff48;
    }
    Variant::GetCoroutine((Variant *)local_90);
    peVar4 = std::__shared_ptr_access<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Jinx::ICoroutine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    uVar2 = (**peVar4->_vptr_ICoroutine)();
    std::shared_ptr<Jinx::ICoroutine>::~shared_ptr((shared_ptr<Jinx::ICoroutine> *)local_90);
    if ((uVar2 & 1) != 0) {
      __range2._7_1_ = true;
      goto LAB_0013ff2c;
    }
    std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator++(&__end2);
  } while( true );
}

Assistant:

inline_t Variant AnyIsFinished(ScriptPtr script, const Parameters & params)
	{
		auto collPtr = params[0].GetCollection();
		bool anyFinished = false;
		for (const auto & pair : *collPtr)
		{
			if (!pair.second.IsCoroutine())
			{
				ScriptIPtr s = std::static_pointer_cast<Script>(script);
				s->Error("Invalid parameters to 'any (of) {} (is) finished' function");
				return false;
			}
			if (pair.second.GetCoroutine()->IsFinished())
			{
				anyFinished = true;
				break;
			}
		}
		return anyFinished;
	}